

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_goto(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTcToken *pCVar3;
  CTcTokenizer *this_00;
  undefined4 *in_RSI;
  CTPNStmGoto *goto_stm;
  CTcTokenizer *in_stack_ffffffffffffffb8;
  undefined8 local_20;
  undefined8 local_8;
  
  tVar1 = CTcTokenizer::next(in_stack_ffffffffffffffb8);
  if (tVar1 == TOKT_SYM) {
    local_20 = (CTPNStmGoto *)CTcPrsAllocObj::operator_new(0x2693f0);
    pCVar3 = CTcTokenizer::getcur(G_tok);
    this_00 = (CTcTokenizer *)CTcToken::get_text(pCVar3);
    pCVar3 = CTcTokenizer::getcur(G_tok);
    CTcToken::get_text_len(pCVar3);
    CTPNStmGoto::CTPNStmGoto(local_20,(textchar_t *)this_00,(size_t)pCVar3);
    CTcTokenizer::next(this_00);
  }
  else {
    CTcTokenizer::log_error(0x2b57);
    local_20 = (CTPNStmGoto *)0x0;
  }
  iVar2 = parse_req_sem();
  if (iVar2 == 0) {
    local_8 = local_20;
  }
  else {
    *in_RSI = 1;
    local_8 = (CTPNStmGoto *)0x0;
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_goto(int *err)
{
    CTPNStmGoto *goto_stm;
    
    /* skip the 'goto' keyword, and demand that a symbol follows */
    if (G_tok->next() == TOKT_SYM)
    {
        /* create the parse node for the 'goto' statement */
        goto_stm = new CTPNStmGoto(G_tok->getcur()->get_text(),
                                   G_tok->getcur()->get_text_len());
        
        /* skip the symbol */
        G_tok->next();
    }
    else
    {
        /* log the error */
        G_tok->log_error(TCERR_GOTO_REQ_LABEL);

        /* no statement */
        goto_stm = 0;
    }

    /* parse the required semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the statement node */
    return goto_stm;
}